

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRowSingleton
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *row,int *i)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int _j;
  int iVar6;
  int _i;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  pointer pnVar8;
  pointer pnVar9;
  undefined8 uVar10;
  bool bVar11;
  type_conflict5 tVar12;
  bool bVar13;
  bool strictUp;
  bool strictLo;
  long lVar14;
  double *pdVar15;
  RowSingletonPS *this_00;
  cpp_dec_float<50U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_778;
  cpp_dec_float<50U,_int,_void> local_738;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_6a8;
  cpp_dec_float<50U,_int,_void> local_698;
  fpclass_type local_658;
  int32_t iStack_654;
  undefined8 uStack_650;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_648;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_608;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pNVar7 = row->m_elem;
  aij.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
  aij.m_backend.data._M_elems[0] = (pNVar7->val).m_backend.data._M_elems[0];
  aij.m_backend.data._M_elems[1] = (pNVar7->val).m_backend.data._M_elems[1];
  aij.m_backend.data._M_elems[2] = (pNVar7->val).m_backend.data._M_elems[2];
  aij.m_backend.data._M_elems[3] = (pNVar7->val).m_backend.data._M_elems[3];
  aij.m_backend.data._M_elems[4] = (pNVar7->val).m_backend.data._M_elems[4];
  aij.m_backend.data._M_elems[5] = (pNVar7->val).m_backend.data._M_elems[5];
  aij.m_backend.data._M_elems[6] = (pNVar7->val).m_backend.data._M_elems[6];
  aij.m_backend.data._M_elems[7] = (pNVar7->val).m_backend.data._M_elems[7];
  iVar3 = (pNVar7->val).m_backend.exp;
  bVar13 = (pNVar7->val).m_backend.neg;
  fVar4 = (pNVar7->val).m_backend.fpclass;
  iVar5 = (pNVar7->val).m_backend.prec_elem;
  _j = pNVar7->idx;
  lVar14 = (long)_j;
  aij.m_backend.exp = iVar3;
  aij.m_backend.neg = bVar13;
  aij.m_backend.fpclass = fVar4;
  aij.m_backend.prec_elem = iVar5;
  pdVar15 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_738,-*pdVar15,(type *)0x0);
  pdVar15 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_778,*pdVar15,(type *)0x0);
  local_308.m_backend.data._M_elems[8] = aij.m_backend.data._M_elems[8];
  local_308.m_backend.data._M_elems[9] = aij.m_backend.data._M_elems[9];
  local_308.m_backend.data._M_elems[1] = aij.m_backend.data._M_elems[1];
  local_308.m_backend.data._M_elems[0] = aij.m_backend.data._M_elems[0];
  local_308.m_backend.data._M_elems[3] = aij.m_backend.data._M_elems[3];
  local_308.m_backend.data._M_elems[2] = aij.m_backend.data._M_elems[2];
  local_308.m_backend.data._M_elems[5] = aij.m_backend.data._M_elems[5];
  local_308.m_backend.data._M_elems[4] = aij.m_backend.data._M_elems[4];
  local_308.m_backend.data._M_elems[7] = aij.m_backend.data._M_elems[7];
  local_308.m_backend.data._M_elems[6] = aij.m_backend.data._M_elems[6];
  local_308.m_backend.exp = iVar3;
  local_308.m_backend.neg = bVar13;
  local_308.m_backend.fpclass = fVar4;
  local_308.m_backend.prec_elem = iVar5;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,0.0,(type *)0x0);
  epsZero(&local_a0,this);
  bVar11 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_308,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_68,&local_a0);
  if (bVar11) {
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_698,-*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator<=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_698);
    if (tVar12) {
      pdVar15 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar15,(type *)0x0);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&aij.m_backend);
    }
    local_738.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_738.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_738.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_738.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_738.data._M_elems[6] = result.m_backend.data._M_elems[6];
    local_738.data._M_elems[7] = result.m_backend.data._M_elems[7];
    local_738.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_738.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_738.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_738.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_738.exp = result.m_backend.exp;
    local_738.neg = result.m_backend.neg;
    local_738.fpclass = result.m_backend.fpclass;
    local_738.prec_elem = result.m_backend.prec_elem;
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_698,*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator>=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_698);
    if (tVar12) goto LAB_0027136a;
    u = &(lp->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).right.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
LAB_00271396:
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,u,&aij.m_backend);
  }
  else {
    local_348.m_backend.data._M_elems[8] = aij.m_backend.data._M_elems[8];
    local_348.m_backend.data._M_elems[9] = aij.m_backend.data._M_elems[9];
    local_348.m_backend.data._M_elems[1] = aij.m_backend.data._M_elems[1];
    local_348.m_backend.data._M_elems[0] = aij.m_backend.data._M_elems[0];
    local_348.m_backend.data._M_elems[3] = aij.m_backend.data._M_elems[3];
    local_348.m_backend.data._M_elems[2] = aij.m_backend.data._M_elems[2];
    local_348.m_backend.data._M_elems[5] = aij.m_backend.data._M_elems[5];
    local_348.m_backend.data._M_elems[4] = aij.m_backend.data._M_elems[4];
    local_348.m_backend.data._M_elems[7] = aij.m_backend.data._M_elems[7];
    local_348.m_backend.data._M_elems[6] = aij.m_backend.data._M_elems[6];
    local_348.m_backend.exp = iVar3;
    local_348.m_backend.neg = bVar13;
    local_348.m_backend.fpclass = fVar4;
    local_348.m_backend.prec_elem = iVar5;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_d8,0.0,(type *)0x0);
    epsZero(&local_110,this);
    bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_348,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d8,&local_110);
    if (!bVar13) {
      iVar3 = *i;
      pnVar8 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_388.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar8[iVar3].m_backend.data._M_elems + 8);
      local_388.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar3].m_backend.data;
      local_388.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar8[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 4;
      local_388.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_388.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_388.m_backend.exp = pnVar8[iVar3].m_backend.exp;
      local_388.m_backend.neg = pnVar8[iVar3].m_backend.neg;
      local_388.m_backend.fpclass = pnVar8[iVar3].m_backend.fpclass;
      local_388.m_backend.prec_elem = pnVar8[iVar3].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_148,0.0,(type *)0x0);
      feastol(&local_180,this);
      bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_388,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_148,&local_180);
      if (bVar13) {
        return INFEASIBLE;
      }
      iVar3 = *i;
      pnVar8 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar8[iVar3].m_backend.data._M_elems + 8);
      local_3c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar3].m_backend.data;
      local_3c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar8[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 4;
      local_3c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_3c8.m_backend.exp = pnVar8[iVar3].m_backend.exp;
      local_3c8.m_backend.neg = pnVar8[iVar3].m_backend.neg;
      local_3c8.m_backend.fpclass = pnVar8[iVar3].m_backend.fpclass;
      local_3c8.m_backend.prec_elem = pnVar8[iVar3].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_1b8,0.0,(type *)0x0);
      feastol(&local_1f0,this);
      bVar13 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_3c8,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1b8,&local_1f0);
      if (bVar13) {
        return INFEASIBLE;
      }
      goto LAB_002713f8;
    }
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_698,*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator>=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_698);
    if (tVar12) {
      pdVar15 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar15,(type *)0x0);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&aij.m_backend);
    }
    local_738.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_738.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_738.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_738.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_738.data._M_elems[6] = result.m_backend.data._M_elems[6];
    local_738.data._M_elems[7] = result.m_backend.data._M_elems[7];
    local_738.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_738.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_738.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_738.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_738.exp = result.m_backend.exp;
    local_738.neg = result.m_backend.neg;
    local_738.fpclass = result.m_backend.fpclass;
    local_738.prec_elem = result.m_backend.prec_elem;
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_698,-*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator<=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_698);
    if (!tVar12) {
      u = &(lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
      goto LAB_00271396;
    }
LAB_0027136a:
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar15,(type *)0x0);
  }
  local_778.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_778.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_778.data._M_elems[7] = result.m_backend.data._M_elems[7];
  local_778.data._M_elems[6] = result.m_backend.data._M_elems[6];
  local_778.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_778.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_778.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_778.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_778.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_778.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_778.exp = result.m_backend.exp;
  local_778.neg = result.m_backend.neg;
  local_778.fpclass = result.m_backend.fpclass;
  local_778.prec_elem = result.m_backend.prec_elem;
LAB_002713f8:
  local_408.m_backend.data._M_elems[8] = local_738.data._M_elems[8];
  local_408.m_backend.data._M_elems[9] = local_738.data._M_elems[9];
  local_408.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
  local_408.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
  local_408.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
  local_408.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
  local_408.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
  local_408.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
  local_408.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
  local_408.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
  local_408.m_backend.exp = local_738.exp;
  local_408.m_backend.neg = local_738.neg;
  local_408.m_backend.fpclass = local_738.fpclass;
  local_408.m_backend.prec_elem = local_738.prec_elem;
  epsZero(&local_228,this);
  bVar13 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_408,&local_228);
  if (bVar13) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_738,0.0);
  }
  local_448.m_backend.data._M_elems[8] = local_778.data._M_elems[8];
  local_448.m_backend.data._M_elems[9] = local_778.data._M_elems[9];
  local_448.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
  local_448.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
  local_448.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
  local_448.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
  local_448.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
  local_448.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
  local_448.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
  local_448.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
  local_448.m_backend.exp = local_778.exp;
  local_448.m_backend.neg = local_778.neg;
  local_448.m_backend.fpclass = local_778.fpclass;
  local_448.m_backend.prec_elem = local_778.prec_elem;
  epsZero(&local_260,this);
  bVar13 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_448,&local_260);
  if (bVar13) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_778,0.0);
  }
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 8);
  result.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
  result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  result.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  result.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2)
  ;
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  uVar10 = *(undefined8 *)(puVar2 + 2);
  result.m_backend.data._M_elems[6] = (uint)uVar10;
  result.m_backend.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
  iVar3 = pnVar8[lVar14].m_backend.exp;
  bVar13 = pnVar8[lVar14].m_backend.neg;
  local_658 = pnVar8[lVar14].m_backend.fpclass;
  iStack_654 = pnVar8[lVar14].m_backend.prec_elem;
  uStack_650 = 0;
  local_698.data._M_elems._32_8_ = *(undefined8 *)(pnVar9[lVar14].m_backend.data._M_elems + 8);
  local_698.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar14].m_backend.data;
  local_698.data._M_elems._8_8_ = *(undefined8 *)(pnVar9[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 4;
  local_698.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_698.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  iVar6 = pnVar9[lVar14].m_backend.exp;
  bVar11 = pnVar9[lVar14].m_backend.neg;
  fVar4 = pnVar9[lVar14].m_backend.fpclass;
  iVar5 = pnVar9[lVar14].m_backend.prec_elem;
  local_488.m_backend.data._M_elems[8] = local_778.data._M_elems[8];
  local_488.m_backend.data._M_elems[9] = local_778.data._M_elems[9];
  local_488.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
  local_488.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
  local_488.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
  local_488.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
  local_488.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
  local_488.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
  local_488.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
  local_488.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
  local_488.m_backend.exp = local_778.exp;
  local_488.m_backend.neg = local_778.neg;
  local_488.m_backend.fpclass = local_778.fpclass;
  local_488.m_backend.prec_elem = local_778.prec_elem;
  local_4c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar14].m_backend.data;
  local_4c8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar9[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 4;
  local_4c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_4c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  local_4c8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar9[lVar14].m_backend.data._M_elems + 8);
  local_4c8.m_backend.exp = iVar6;
  local_4c8.m_backend.neg = bVar11;
  local_4c8.m_backend.fpclass = fVar4;
  local_4c8.m_backend.prec_elem = iVar5;
  feastol(&local_298,this);
  strictUp = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_488,&local_4c8,&local_298);
  if (strictUp) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(lp,lVar14,&local_778,0);
  }
  local_508.m_backend.data._M_elems[8] = local_738.data._M_elems[8];
  local_508.m_backend.data._M_elems[9] = local_738.data._M_elems[9];
  local_508.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
  local_508.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
  local_508.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
  local_508.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
  local_508.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
  local_508.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
  local_508.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
  local_508.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
  local_508.m_backend.exp = local_738.exp;
  local_508.m_backend.neg = local_738.neg;
  local_508.m_backend.fpclass = local_738.fpclass;
  local_508.m_backend.prec_elem = local_738.prec_elem;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_548.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  local_548.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  local_548.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_548.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  local_548.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 8);
  local_548.m_backend.exp = pnVar8[lVar14].m_backend.exp;
  local_548.m_backend.neg = pnVar8[lVar14].m_backend.neg;
  local_548.m_backend.fpclass = pnVar8[lVar14].m_backend.fpclass;
  local_548.m_backend.prec_elem = pnVar8[lVar14].m_backend.prec_elem;
  feastol(&local_2d0,this);
  strictLo = GTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_508,&local_548,&local_2d0);
  if (strictLo) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,lVar14,&local_738,0);
  }
  this_00 = (RowSingletonPS *)operator_new(0x218);
  _i = *i;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_588.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 8);
  local_588.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  local_588.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  local_588.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_588.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  local_588.m_backend.exp = pnVar8[lVar14].m_backend.exp;
  local_588.m_backend.neg = pnVar8[lVar14].m_backend.neg;
  local_588.m_backend.fpclass = pnVar8[lVar14].m_backend.fpclass;
  local_588.m_backend.prec_elem = pnVar8[lVar14].m_backend.prec_elem;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_5c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  local_5c8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  local_5c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_5c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  local_5c8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 8);
  local_5c8.m_backend.exp = pnVar8[lVar14].m_backend.exp;
  local_5c8.m_backend.neg = pnVar8[lVar14].m_backend.neg;
  local_5c8.m_backend.fpclass = pnVar8[lVar14].m_backend.fpclass;
  local_5c8.m_backend.prec_elem = pnVar8[lVar14].m_backend.prec_elem;
  local_608.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_608.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_608.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
  local_608.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
  local_608.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_608.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_608.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_608.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_608.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_608.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_608.m_backend.fpclass = local_658;
  local_608.m_backend.prec_elem = iStack_654;
  local_648.m_backend.data._M_elems[8] = local_698.data._M_elems[8];
  local_648.m_backend.data._M_elems[9] = local_698.data._M_elems[9];
  local_648.m_backend.data._M_elems[4] = local_698.data._M_elems[4];
  local_648.m_backend.data._M_elems[5] = local_698.data._M_elems[5];
  local_648.m_backend.data._M_elems[6] = local_698.data._M_elems[6];
  local_648.m_backend.data._M_elems[7] = local_698.data._M_elems[7];
  local_648.m_backend.data._M_elems[0] = local_698.data._M_elems[0];
  local_648.m_backend.data._M_elems[1] = local_698.data._M_elems[1];
  local_648.m_backend.data._M_elems[2] = local_698.data._M_elems[2];
  local_648.m_backend.data._M_elems[3] = local_698.data._M_elems[3];
  local_648.m_backend.exp = iVar6;
  local_648.m_backend.neg = bVar11;
  local_648.m_backend.fpclass = fVar4;
  local_648.m_backend.prec_elem = iVar5;
  local_608.m_backend.exp = iVar3;
  local_608.m_backend.neg = bVar13;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_6a8,
             &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RowSingletonPS::RowSingletonPS
            (this_00,lp,_i,_j,strictLo,strictUp,&local_588,&local_5c8,&local_608,&local_648,
             (shared_ptr<soplex::Tolerances> *)&local_6a8);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowSingletonPS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6a8._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  removeRow(this,lp,*i);
  piVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remRows;
  *piVar1 = *piVar1 + 1;
  piVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remNzos;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->m_stat).data + 2;
  *piVar1 = *piVar1 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeRowSingleton(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 1);

   R aij = row.value(0);
   int  j   = row.index(0);
   R lo  = R(-infinity);
   R up  =  R(infinity);

   SPxOut::debug(this, "IMAISM22 row {}: singleton -> val={} lhs={} rhs={}", i, aij, lp.lhs(i),
                 lp.rhs(i));

   if(GT(aij, R(0.0), this->epsZero()))            // aij > 0
   {
      lo = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) / aij;
      up = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) / aij;
   }
   else if(LT(aij, R(0.0), this->epsZero()))       // aij < 0
   {
      lo = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) / aij;
      up = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) / aij;
   }
   else if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
   {
      // aij == 0, rhs < 0 or lhs > 0
      SPxOut::debug(this, " infeasible\n");
      return this->INFEASIBLE;
   }

   if(isZero(lo, this->epsZero()))
      lo = 0.0;

   if(isZero(up, this->epsZero()))
      up = 0.0;

   SPxOut::debug(this, " removed, lower={} ({}) upper={} ({})\n", lo, lp.lower(j), up, lp.upper(j));

   bool stricterUp = false;
   bool stricterLo = false;

   R oldLo = lp.lower(j);
   R oldUp = lp.upper(j);

   if(LTrel(up, lp.upper(j), feastol()))
   {
      lp.changeUpper(j, up);
      stricterUp = true;
   }

   if(GTrel(lo, lp.lower(j), feastol()))
   {
      lp.changeLower(j, lo);
      stricterLo = true;
   }

   std::shared_ptr<PostStep> ptr(new RowSingletonPS(lp, i, j, stricterLo, stricterUp,
                                 lp.lower(j),
                                 lp.upper(j), oldLo, oldUp, this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);

   this->m_remRows++;
   this->m_remNzos++;
   ++m_stat[SINGLETON_ROW];

   return this->OKAY;
}